

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set.hpp
# Opt level: O2

bool __thiscall
Lib::Set<Kernel::Variable,_Lib::StlHash>::contains
          (Set<Kernel::Variable,_Lib::StlHash> *this,Variable val)

{
  uint uVar1;
  Cell *pCVar2;
  ulong uVar3;
  uint code;
  
  uVar3 = 2;
  if (2 < val._num) {
    uVar3 = (ulong)val._num;
  }
  pCVar2 = this->_entries + uVar3 % (ulong)(uint)this->_capacity;
  while ((uVar1 = pCVar2->code, uVar1 != 0 &&
         ((uVar1 != (uint)uVar3 || uVar1 == 1 || ((pCVar2->value)._num != val._num))))) {
    pCVar2 = pCVar2 + 1;
    if (pCVar2 == this->_afterLast) {
      pCVar2 = this->_entries;
    }
  }
  return uVar1 != 0;
}

Assistant:

bool contains (Val val) const
  {
    unsigned code = Hash::hash(val);
    if (code < 2) {
      code = 2;
    }
    for (Cell* cell = firstCellForCode(code);
	 ! cell->empty();
	 cell = nextCell(cell)) {
      if (cell->deleted()) {
	continue;
      }
      if (cell->code == code &&
	  Hash::equals(cell->value,val)) {
	return true;
      }
    }
    return false;
  }